

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkLayer::InternalSwap
          (NeuralNetworkLayer *this,NeuralNetworkLayer *other)

{
  bool bVar1;
  uint32_t uVar2;
  intptr_t iVar3;
  void *pvVar4;
  LayerUnion LVar5;
  long __tmp;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->input_).super_RepeatedPtrFieldBase,&(other->input_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->inputtensor_).super_RepeatedPtrFieldBase,
             &(other->inputtensor_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->outputtensor_).super_RepeatedPtrFieldBase,
             &(other->outputtensor_).super_RepeatedPtrFieldBase);
  pvVar4 = (other->name_).tagged_ptr_.ptr_;
  (other->name_).tagged_ptr_.ptr_ = (this->name_).tagged_ptr_.ptr_;
  (this->name_).tagged_ptr_.ptr_ = pvVar4;
  bVar1 = this->isupdatable_;
  this->isupdatable_ = other->isupdatable_;
  other->isupdatable_ = bVar1;
  LVar5 = this->layer_;
  this->layer_ = other->layer_;
  other->layer_ = LVar5;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  return;
}

Assistant:

void NeuralNetworkLayer::InternalSwap(NeuralNetworkLayer* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  inputtensor_.InternalSwap(&other->inputtensor_);
  outputtensor_.InternalSwap(&other->outputtensor_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &name_, lhs_arena,
      &other->name_, rhs_arena
  );
  swap(isupdatable_, other->isupdatable_);
  swap(layer_, other->layer_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}